

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::PolyKernel::_InternalParse(PolyKernel *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  double *p;
  char cVar5;
  uint uVar6;
  pair<const_char_*,_unsigned_int> pVar7;
  double *local_30;
  
  local_30 = (double *)ptr;
  bVar3 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_30,ctx->group_depth_);
  if (!bVar3) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    do {
      bVar1 = *(byte *)local_30;
      uVar6 = (uint)bVar1;
      p = (double *)((long)local_30 + 1);
      if ((char)bVar1 < '\0') {
        uVar6 = ((uint)bVar1 + (uint)*(byte *)p * 0x80) - 0x80;
        if ((char)*(byte *)p < '\0') {
          pVar7 = google::protobuf::internal::ReadTagFallback((char *)local_30,uVar6);
          p = (double *)pVar7.first;
          uVar6 = pVar7.second;
        }
        else {
          p = (double *)((long)local_30 + 2);
        }
      }
      uVar4 = uVar6 >> 3;
      cVar5 = (char)uVar6;
      local_30 = p;
      if (uVar4 == 3) {
        if (cVar5 != '\x19') goto LAB_002bc5a6;
        this->gamma_ = *p;
LAB_002bc59b:
        local_30 = p + 1;
      }
      else {
        if (uVar4 == 2) {
          if (cVar5 == '\x11') {
            this->c_ = *p;
            goto LAB_002bc59b;
          }
LAB_002bc5a6:
          if ((uVar6 == 0) || ((uVar6 & 7) == 4)) {
            if (p == (double *)0x0) {
              return (char *)0x0;
            }
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar6 - 1;
            return (char *)p;
          }
          uVar2 = this_00->ptr_;
          if ((uVar2 & 1) == 0) {
            unknown = google::protobuf::internal::InternalMetadata::
                      mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
          }
          else {
            unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((uVar2 & 0xfffffffffffffffc) + 8);
          }
          local_30 = (double *)
                     google::protobuf::internal::UnknownFieldParse
                               (uVar6,unknown,(char *)local_30,ctx);
        }
        else {
          if ((uVar4 != 1) || (cVar5 != '\b')) goto LAB_002bc5a6;
          bVar1 = *(byte *)p;
          uVar6 = (uint)bVar1;
          local_30 = (double *)((long)p + 1);
          if (-1 < (char)bVar1) {
LAB_002bc56e:
            this->degree_ = uVar6;
            goto LAB_002bc5df;
          }
          uVar6 = ((uint)bVar1 + (uint)*(byte *)local_30 * 0x80) - 0x80;
          if (-1 < (char)*(byte *)local_30) {
            local_30 = (double *)((long)p + 2);
            goto LAB_002bc56e;
          }
          local_30 = p;
          pVar7 = google::protobuf::internal::VarintParseSlow32((char *)p,uVar6);
          local_30 = (double *)pVar7.first;
          this->degree_ = pVar7.second;
        }
        if (local_30 == (double *)0x0) {
          return (char *)0x0;
        }
      }
LAB_002bc5df:
      bVar3 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_30,ctx->group_depth_);
    } while (!bVar3);
  }
  return (char *)local_30;
}

Assistant:

const char* PolyKernel::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // int32 degree = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          degree_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // double c = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 17)) {
          c_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr);
          ptr += sizeof(double);
        } else
          goto handle_unusual;
        continue;
      // double gamma = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 25)) {
          gamma_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr);
          ptr += sizeof(double);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}